

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurfaceAccess.hpp
# Opt level: O0

RGBA tcu::toRGBAMasked(Vec4 *v,deUint8 mask)

{
  byte bVar1;
  float fVar2;
  uint local_38;
  uint local_30;
  uint local_28;
  uint local_20;
  deUint8 mask_local;
  Vec4 *v_local;
  
  if ((mask & 1) == 0) {
    local_20 = 0;
  }
  else {
    fVar2 = Vector<float,_4>::x(v);
    bVar1 = floatToU8(fVar2);
    local_20 = (uint)bVar1;
  }
  if ((mask & 2) == 0) {
    local_28 = 0;
  }
  else {
    fVar2 = Vector<float,_4>::y(v);
    bVar1 = floatToU8(fVar2);
    local_28 = (uint)bVar1;
  }
  if ((mask & 4) == 0) {
    local_30 = 0;
  }
  else {
    fVar2 = Vector<float,_4>::z(v);
    bVar1 = floatToU8(fVar2);
    local_30 = (uint)bVar1;
  }
  if ((mask & 8) == 0) {
    local_38 = 0xff;
  }
  else {
    fVar2 = Vector<float,_4>::w(v);
    bVar1 = floatToU8(fVar2);
    local_38 = (uint)bVar1;
  }
  RGBA::RGBA((RGBA *)((long)&v_local + 4),local_20,local_28,local_30,local_38);
  return (RGBA)v_local._4_4_;
}

Assistant:

inline tcu::RGBA toRGBAMasked (const tcu::Vec4& v, deUint8 mask)
{
	return tcu::RGBA((mask&tcu::RGBA::RED_MASK)		? tcu::floatToU8(v.x()) : 0,
					 (mask&tcu::RGBA::GREEN_MASK)	? tcu::floatToU8(v.y()) : 0,
					 (mask&tcu::RGBA::BLUE_MASK)	? tcu::floatToU8(v.z()) : 0,
					 (mask&tcu::RGBA::ALPHA_MASK)	? tcu::floatToU8(v.w()) : 0xFF); //!< \note Alpha defaults to full saturation when reading masked format
}